

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructSerializer.hpp
# Opt level: O0

size_t mserialize::
       StructSerializer<binlog::EventSource,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::id>,_std::integral_constant<binlog::Severity_binlog::EventSource::*,_&binlog::EventSource::severity>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::category>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::function>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::file>,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::line>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::formatString>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::argumentTags>_>
       ::serialized_size(EventSource *t)

{
  size_t s;
  size_t *__end0;
  size_t *__begin0;
  size_t (*__range2) [9];
  size_t result;
  size_t field_sizes [9];
  offset_in_EventSource_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  in_stack_ffffffffffffff78;
  EventSource *in_stack_ffffffffffffff80;
  long *local_70;
  size_t local_60;
  long local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  size_t local_30;
  size_t local_28;
  size_t local_20;
  long alStack_10 [2];
  
  local_58 = 0;
  local_50 = StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
             ::serialized_size_member<binlog::EventSource,unsigned_long>
                       (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_48 = StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
             ::serialized_size_member<binlog::EventSource,binlog::Severity>
                       (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_40 = StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
             ::serialized_size_member<binlog::EventSource,std::__cxx11::string>
                       (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_38 = StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
             ::serialized_size_member<binlog::EventSource,std::__cxx11::string>
                       (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_30 = StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
             ::serialized_size_member<binlog::EventSource,std::__cxx11::string>
                       (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_28 = StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
             ::serialized_size_member<binlog::EventSource,unsigned_long>
                       (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_20 = StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
             ::serialized_size_member<binlog::EventSource,std::__cxx11::string>
                       (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::serialized_size_member<binlog::EventSource,std::__cxx11::string>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_60 = 0;
  for (local_70 = &local_58; local_70 != alStack_10; local_70 = local_70 + 1) {
    local_60 = *local_70 + local_60;
  }
  return local_60;
}

Assistant:

static std::size_t serialized_size(const T& t)
  {
    const std::size_t field_sizes[] = {0, serialized_size_member(t, Members::value)...};

    std::size_t result = 0;
    for (auto s : field_sizes) { result += s; }
    return result;
  }